

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__de_iphone(stbi__png *z)

{
  stbi_uc sVar1;
  byte bVar2;
  stbi__context *psVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  stbi_uc *psVar7;
  int iVar8;
  uint uVar9;
  
  psVar3 = z->s;
  psVar7 = z->out;
  iVar8 = psVar3->img_y * psVar3->img_x;
  if (psVar3->img_out_n == 4) {
    lVar5 = __tls_get_addr(&PTR_001f4f18);
    iVar4 = stbi__unpremultiply_on_load_global;
    if (*(int *)(lVar5 + 0x14) != 0) {
      iVar4 = *(int *)(lVar5 + 0x10);
    }
    if (iVar4 == 0) {
      if (iVar8 != 0) {
        lVar5 = 0;
        do {
          sVar1 = psVar7[lVar5 * 4];
          psVar7[lVar5 * 4] = psVar7[lVar5 * 4 + 2];
          psVar7[lVar5 * 4 + 2] = sVar1;
          lVar5 = lVar5 + 1;
        } while (iVar8 != (int)lVar5);
      }
    }
    else if (iVar8 != 0) {
      lVar5 = 0;
      do {
        bVar6 = psVar7[lVar5 * 4 + 3];
        bVar2 = psVar7[lVar5 * 4];
        if (bVar6 == 0) {
          psVar7[lVar5 * 4] = psVar7[lVar5 * 4 + 2];
          psVar7[lVar5 * 4 + 2] = bVar2;
        }
        else {
          uVar9 = (uint)bVar6;
          bVar6 = bVar6 >> 1;
          psVar7[lVar5 * 4] =
               (stbi_uc)((((uint)psVar7[lVar5 * 4 + 2] * 0x100 - (uint)psVar7[lVar5 * 4 + 2]) +
                         (uint)bVar6) / uVar9);
          psVar7[lVar5 * 4 + 1] =
               (stbi_uc)((((uint)psVar7[lVar5 * 4 + 1] * 0x100 - (uint)psVar7[lVar5 * 4 + 1]) +
                         (uint)bVar6) / uVar9);
          psVar7[lVar5 * 4 + 2] =
               (stbi_uc)((((uint)bVar2 * 0x100 - (uint)bVar2) + (uint)bVar6) / uVar9);
        }
        lVar5 = lVar5 + 1;
      } while (iVar8 != (int)lVar5);
    }
  }
  else {
    if (psVar3->img_out_n != 3) {
      __assert_fail("s->img_out_n == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                    ,0x13b7,"void stbi__de_iphone(stbi__png *)");
    }
    for (; iVar8 != 0; iVar8 = iVar8 + -1) {
      sVar1 = *psVar7;
      *psVar7 = psVar7[2];
      psVar7[2] = sVar1;
      psVar7 = psVar7 + 3;
    }
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               stbi_uc half = a / 2;
               p[0] = (p[2] * 255 + half) / a;
               p[1] = (p[1] * 255 + half) / a;
               p[2] = ( t   * 255 + half) / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}